

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O2

void free_allocated_ranges(ranges_entry *base)

{
  ranges_entry *prVar1;
  
  while (base != (ranges_entry *)0x0) {
    prVar1 = base->next;
    free(base);
    base = prVar1;
  }
  return;
}

Assistant:

static void
free_allocated_ranges( struct ranges_entry *base)
{
    struct ranges_entry *cur = 0;
    struct ranges_entry *next = 0;
    for ( cur = base ; cur ; cur = next ) {
        next = cur->next;
        free(cur);
    }
}